

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

bool __thiscall
dg::vr::ValueRelations::merge(ValueRelations *this,ValueRelations *other,Relations relations)

{
  bool bVar1;
  Type TVar2;
  RelationEdge *this_00;
  HandlePtr this_01;
  Handle in_RSI;
  Bucket *in_RDI;
  bool ch;
  HandlePtr thisFromH;
  HandlePtr thisToH;
  RelationEdge *edge;
  iterator __end2;
  iterator __begin2;
  RelGraph *__range2;
  bool noConflict;
  HandlePtr in_stack_fffffffffffffea8;
  Bucket *pBVar3;
  HandlePtr in_stack_fffffffffffffeb0;
  HandlePtr pBVar4;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_fffffffffffffeb8;
  Handle otherH;
  Handle in_stack_fffffffffffffec8;
  Type in_stack_fffffffffffffedc;
  Handle in_stack_fffffffffffffef8;
  ValueRelations *in_stack_ffffffffffffff00;
  ValueRelations *in_stack_ffffffffffffff08;
  Relations *in_stack_ffffffffffffffa8;
  Bucket *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  Bucket *in_stack_ffffffffffffffc0;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_ffffffffffffffc8;
  bool local_19;
  
  local_19 = true;
  RelationsGraph<dg::vr::ValueRelations>::begin
            ((RelationsGraph<dg::vr::ValueRelations> *)in_stack_fffffffffffffec8);
  RelationsGraph<dg::vr::ValueRelations>::end(in_stack_fffffffffffffeb8);
  do {
    bVar1 = vr::operator!=((EdgeIterator *)in_stack_fffffffffffffeb0,
                           (EdgeIterator *)in_stack_fffffffffffffea8);
    if (!bVar1) {
      RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::~EdgeIterator
                ((EdgeIterator *)in_stack_fffffffffffffeb0);
      RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::~EdgeIterator
                ((EdgeIterator *)in_stack_fffffffffffffeb0);
      return local_19;
    }
    this_00 = RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::operator*
                        ((EdgeIterator *)0x20a29a);
    Bucket::RelationEdge::rel(this_00);
    bVar1 = Relations::has((Relations *)in_stack_fffffffffffffeb0,
                           (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    if (bVar1) {
      TVar2 = Bucket::RelationEdge::rel(this_00);
      pBVar3 = in_stack_fffffffffffffea8;
      pBVar4 = in_stack_fffffffffffffeb0;
      if (TVar2 == EQ) {
        in_stack_fffffffffffffec8 = in_RSI;
        Bucket::RelationEdge::to((RelationEdge *)0x20a2e4);
        bVar1 = hasEqual<dg::vr::Bucket>((ValueRelations *)in_RDI,in_stack_fffffffffffffec8);
        pBVar3 = in_stack_fffffffffffffea8;
        pBVar4 = in_stack_fffffffffffffeb0;
        if (!bVar1) goto LAB_0020a3eb;
      }
      Bucket::RelationEdge::to((RelationEdge *)0x20a311);
      this_01 = getAndMerge(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                            in_stack_fffffffffffffef8);
      otherH = in_RSI;
      Bucket::RelationEdge::from((RelationEdge *)0x20a33f);
      in_stack_fffffffffffffeb0 =
           getCorresponding((ValueRelations *)in_RDI,(ValueRelations *)in_stack_fffffffffffffec8,
                            otherH);
      if ((this_01 != (HandlePtr)0x0) && (in_stack_fffffffffffffeb0 != (HandlePtr)0x0)) {
        in_stack_fffffffffffffea8 = in_stack_fffffffffffffeb0;
        Bucket::RelationEdge::rel(this_00);
        bVar1 = RelationsGraph<dg::vr::ValueRelations>::haveConflictingRelation
                          ((RelationsGraph<dg::vr::ValueRelations> *)this_01,
                           in_stack_fffffffffffffea8,in_stack_fffffffffffffedc,in_RDI,
                           (Relations *)in_stack_fffffffffffffec8);
        pBVar4 = in_stack_fffffffffffffeb0;
        if (!bVar1) {
          Bucket::RelationEdge::rel(this_00);
          bVar1 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8);
          in_stack_fffffffffffffedc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
          updateChanged((ValueRelations *)in_RDI,bVar1);
          goto LAB_0020a3eb;
        }
      }
      in_stack_fffffffffffffeb0 = pBVar4;
      in_stack_fffffffffffffea8 = pBVar3;
      local_19 = false;
    }
LAB_0020a3eb:
    RelationsGraph<dg::vr::ValueRelations>::EdgeIterator::operator++
              ((EdgeIterator *)in_stack_fffffffffffffeb0);
  } while( true );
}

Assistant:

bool ValueRelations::merge(const ValueRelations &other, Relations relations) {
    bool noConflict = true;
    for (const auto &edge : other.graph) {
        if (!relations.has(edge.rel()) ||
            (edge.rel() == Relations::EQ && !other.hasEqual(edge.to())))
            continue;

        HandlePtr thisToH = getAndMerge(other, edge.to());
        HandlePtr thisFromH = getCorresponding(other, edge.from());

        if (!thisToH || !thisFromH ||
            graph.haveConflictingRelation(*thisFromH, edge.rel(), *thisToH)) {
            noConflict = false;
            continue;
        }

        bool ch = graph.addRelation(*thisFromH, edge.rel(), *thisToH);
        updateChanged(ch);
    }
    return noConflict;
}